

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_mod.c
# Opt level: O2

bool_t zzRandMod(word *a,word *mod,size_t n,gen_i rng,void *rng_state)

{
  int iVar1;
  size_t pos;
  ulong count;
  long lVar2;
  bool bVar3;
  
  pos = wwBitSize(mod,n);
  count = pos + 7 >> 3;
  lVar2 = 0x40;
  do {
    (*rng)(a,count,rng_state);
    u64From(a,a,count);
    wwTrimHi(a,n,pos);
    iVar1 = wwCmp(a,mod,n);
    if (iVar1 < 0) goto LAB_001524a4;
    bVar3 = lVar2 != 0;
    lVar2 = lVar2 + -1;
  } while (bVar3);
  lVar2 = -1;
LAB_001524a4:
  return (uint)(lVar2 != -1);
}

Assistant:

bool_t zzRandMod(word a[], const word mod[], size_t n, gen_i rng, 
	void* rng_state)
{
	register size_t l;
	register size_t i;
	// pre
	ASSERT(wwIsDisjoint(a, mod, n));
	ASSERT(n > 0 && mod[n - 1] != 0);
	// генерировать
	l = wwBitSize(mod, n);
	i =  B_PER_IMPOSSIBLE;
	do
	{
		rng(a, O_OF_B(l), rng_state);
		wwFrom(a, a, O_OF_B(l));
		wwTrimHi(a, n, l);
	}
	while (wwCmp(a, mod, n) >= 0 && i--);
	// выход
	l = 0;
	return i != SIZE_MAX;
}